

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_raw(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  byte bVar1;
  gravity_object_t *pgVar2;
  gravity_value_t value;
  uint32_t uVar3;
  double dVar4;
  uint local_34;
  uint32_t i;
  uint32_t n;
  uint32_t ascii;
  gravity_string_t *string;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar2 = (args->field_1).p;
  i = 0;
  uVar3 = utf8_charbytes((char *)pgVar2->objclass,0);
  for (local_34 = 0; local_34 < uVar3; local_34 = local_34 + 1) {
    bVar1 = *(byte *)((long)&pgVar2->objclass->isa + (ulong)local_34);
    dVar4 = pow(10.0,(double)(~local_34 + uVar3));
    i = (int)(long)((double)bVar1 * dVar4) + i;
  }
  value.field_1.n._0_4_ = i;
  value.isa = gravity_class_int;
  value.field_1.n._4_4_ = 0;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool string_raw (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    
    uint32_t ascii = 0;
    uint32_t n = utf8_charbytes(string->s, 0);
    for (uint32_t i=0; i<n; ++i) {
        // if (n > 1) {printf("%u (%d)\n", (uint8_t)string->s[i], (uint32_t)pow(10, n-(i+1)));}
		ascii += (uint32_t)((uint8_t)string->s[i] * pow(10, n - (i + 1)));
    }
    
    RETURN_VALUE(VALUE_FROM_INT(ascii), rindex);
}